

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

void cli::cleanPath(string *path)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  pcVar2 = (path->_M_dataplus)._M_p;
  pcVar3 = pcVar2;
  for (; pcVar2 != pcVar3 + path->_M_string_length; pcVar2 = pcVar2 + 1) {
    if (*pcVar2 == '\\') {
      *pcVar2 = '/';
      pcVar3 = (path->_M_dataplus)._M_p;
    }
  }
  cVar1 = (pcVar3 + path->_M_string_length)[-1];
  if (cVar1 == '*') {
    std::__cxx11::string::pop_back();
    cVar1 = (path->_M_dataplus)._M_p[path->_M_string_length - 1];
  }
  if (cVar1 == '/') {
    std::__cxx11::string::pop_back();
    return;
  }
  return;
}

Assistant:

void cleanPath(std::string &path)
	{
		for (std::string::iterator it = path.begin(); it != path.end(); ++it)
		{
			if ((*it) == '\\')
				(*it) = '/';
		}

		if (path.back() == '*')
			path.pop_back();
		if (path.back() == '/')
			path.pop_back();
	}